

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Insert(Parse *pParse,SrcList *pTabList,Select *pSelect,IdList *pColumn,int onError,
                  Upsert *pUpsert)

{
  short sVar1;
  sqlite3 *db;
  Schema *pSVar2;
  IdList_item *pIVar3;
  char *pcVar4;
  Index *pIVar5;
  Expr *pExpr;
  bool bVar6;
  Trigger *pTrigger;
  undefined1 *puVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  Table *pTab;
  Vdbe *p;
  int *aRegIdx;
  Index **ppIVar11;
  int *piVar12;
  Parse *pPVar13;
  HashElem *pHVar14;
  u16 uVar15;
  uint uVar16;
  int iVar17;
  Schema **ppSVar18;
  ulong uVar20;
  ulong uVar21;
  Op *pOVar22;
  long lVar23;
  undefined1 *puVar24;
  int op;
  undefined4 in_register_00000084;
  undefined8 uVar25;
  int iVar26;
  ulong uVar27;
  Column *pCVar28;
  int iVar29;
  VTable *zP4;
  SelectDest *pDest;
  bool bVar30;
  ExprList *local_158;
  int local_138;
  byte local_130;
  int local_128;
  int iDataCur;
  ulong local_118;
  ulong local_110;
  ExprList_item *local_108;
  Upsert *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  uint local_e8;
  int iIdxCur;
  Select *local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  IdList_item *local_b8;
  Trigger *local_b0;
  undefined8 local_a8;
  int tmask;
  ulong local_98;
  ExprList_item *local_90;
  NameContext sNC;
  SelectDest dest;
  ExprList_item *pEVar19;
  
  uVar25 = CONCAT44(in_register_00000084,onError);
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  if ((pParse->nErr != 0) || (db->mallocFailed != '\0')) {
    aRegIdx = (int *)0x0;
    local_158 = (ExprList *)0x0;
    goto LAB_00162f2f;
  }
  dest.iSDParm = 0;
  local_a8 = uVar25;
  if (pSelect == (Select *)0x0) {
    local_158 = (ExprList *)0x0;
LAB_00162ffa:
    pSelect = (Select *)0x0;
  }
  else {
    if (((pSelect->selFlags & 0x200) != 0) && (pSelect->pPrior == (Select *)0x0)) {
      local_158 = pSelect->pEList;
      pSelect->pEList = (ExprList *)0x0;
      clearSelect(db,pSelect,1);
      goto LAB_00162ffa;
    }
    local_158 = (ExprList *)0x0;
  }
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  if (pTab == (Table *)0x0) {
    aRegIdx = (int *)0x0;
    goto LAB_00162f2f;
  }
  if (pTab->pSchema == (Schema *)0x0) {
    iVar29 = -1000000;
  }
  else {
    iVar29 = -1;
    ppSVar18 = &db->aDb->pSchema;
    do {
      iVar29 = iVar29 + 1;
      pSVar2 = *ppSVar18;
      ppSVar18 = ppSVar18 + 4;
    } while (pSVar2 != pTab->pSchema);
  }
  aRegIdx = (int *)0x0;
  iVar9 = sqlite3AuthCheck(pParse,0x12,pTab->zName,(char *)0x0,db->aDb[iVar29].zDbSName);
  if (iVar9 != 0) goto LAB_00162f2f;
  local_c0 = CONCAT71(local_c0._1_7_,(char)pTab->tabFlags);
  aRegIdx = (int *)0x0;
  local_b0 = sqlite3TriggersExist(pParse,pTab,0x78,(ExprList *)0x0,&tmask);
  local_e0 = pTab->pSelect;
  iVar9 = sqlite3ViewGetColumnNames(pParse,pTab);
  if (iVar9 != 0) goto LAB_00162f2f;
  bVar8 = (byte)local_c0;
  iVar9 = sqlite3IsReadOnly(pParse,pTab,tmask);
  if ((iVar9 != 0) || (p = sqlite3GetVdbe(pParse), p == (Vdbe *)0x0)) {
    aRegIdx = (int *)0x0;
    goto LAB_00162f2f;
  }
  if (pParse->nested == '\0') {
    p->field_0xc5 = p->field_0xc5 | 0x20;
  }
  sqlite3BeginWriteOperation
            (pParse,(uint)(pSelect != (Select *)0x0 || local_b0 != (Trigger *)0x0),iVar29);
  if ((pColumn == (IdList *)0x0) &&
     (iVar9 = xferOptimization(pParse,pTab,pSelect,(int)local_a8,iVar29), iVar9 != 0)) {
    iVar29 = 0;
    aRegIdx = (int *)0x0;
  }
  else {
    local_ec = autoIncBegin(pParse,iVar29,pTab);
    iVar9 = pParse->nMem;
    local_e8 = iVar9 + 1;
    sVar1 = pTab->nCol;
    uVar16 = (uint)sVar1;
    pEVar19 = (ExprList_item *)(ulong)uVar16;
    pParse->nMem = uVar16 + iVar9 + 1;
    uVar10 = local_e8;
    if (pTab->nModuleArg != 0) {
      uVar10 = iVar9 + 2;
      pParse->nMem = uVar16 + iVar9 + 2;
    }
    local_110 = (ulong)uVar10;
    local_c0 = CONCAT71(local_c0._1_7_,bVar8 >> 5);
    bVar30 = (pTab->tabFlags & 0x80) == 0;
    uVar27 = 0xffffffff;
    local_108 = pEVar19;
    local_100 = pUpsert;
    if (pColumn != (IdList *)0x0) {
      iVar9 = pColumn->nId;
      uVar20 = (ulong)iVar9;
      if (0 < (long)uVar20) {
        pIVar3 = pColumn->a;
        lVar23 = 0;
        do {
          *(undefined4 *)((long)&pIVar3->idx + lVar23) = 0xffffffff;
          lVar23 = lVar23 + 0x10;
        } while (uVar20 << 4 != lVar23);
      }
      if (0 < iVar9) {
        local_d8 = (ulong)(int)uVar16;
        uVar27 = 0xffffffff;
        uVar21 = 0;
        do {
          bVar6 = 0 < sVar1;
          if (0 < (short)local_108) {
            local_b8 = pColumn->a;
            local_c8 = uVar21 * 0x10;
            pcVar4 = local_b8[uVar21].zName;
            pCVar28 = pTab->aCol;
            iVar9 = sqlite3StrICmp(pcVar4,pCVar28->zName);
            if (iVar9 == 0) {
              puVar24 = (undefined1 *)0x0;
            }
            else {
              puVar7 = (undefined1 *)0x1;
              do {
                puVar24 = puVar7;
                pCVar28 = pCVar28 + 1;
                if (pEVar19 == (ExprList_item *)puVar24) {
                  pUpsert = local_100;
                  bVar6 = (long)puVar24 < (long)local_d8;
                  goto LAB_00163361;
                }
                iVar9 = sqlite3StrICmp(pcVar4,pCVar28->zName);
                puVar7 = puVar24 + 1;
              } while (iVar9 != 0);
              bVar6 = (long)puVar24 < (long)local_d8;
            }
            *(int *)((long)&local_b8->idx + local_c8) = (int)puVar24;
            if (uVar21 != ((ulong)puVar24 & 0xffffffff)) {
              bVar30 = false;
            }
            if (puVar24 == (undefined1 *)(long)pTab->iPKey) {
              uVar27 = uVar21;
            }
            uVar27 = uVar27 & 0xffffffff;
            pUpsert = local_100;
          }
LAB_00163361:
          if (!bVar6) {
            pcVar4 = pColumn->a[uVar21].zName;
            iVar9 = sqlite3IsRowid(pcVar4);
            if ((iVar9 == 0) || ((local_c0 & 1) != 0)) {
              aRegIdx = (int *)0x0;
              sqlite3ErrorMsg(pParse,"table %S has no column named %s",pTabList,0,pcVar4);
              pParse->checkSchema = '\x01';
              goto LAB_00162f2f;
            }
            bVar30 = false;
            uVar27 = uVar21 & 0xffffffff;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar20);
      }
    }
    iVar9 = (int)local_110 + 1;
    if (pSelect == (Select *)0x0) {
      sNC.pSrcList = (SrcList *)0x0;
      sNC.nRef = 0;
      sNC.nErr = 0;
      sNC.ncFlags = 0;
      sNC._42_6_ = 0;
      sNC.uNC.pEList = (ExprList *)0x0;
      sNC.pNext = (NameContext *)0x0;
      sNC.pWinSelect = (Select *)0x0;
      sNC.pParse = pParse;
      if (local_158 == (ExprList *)0x0) {
        bVar30 = true;
        uVar10 = 0;
      }
      else {
        uVar10 = local_158->nExpr;
        iVar29 = sqlite3ResolveExprListNames(&sNC,local_158);
        bVar30 = iVar29 == 0;
      }
      if (!bVar30) {
        aRegIdx = (int *)0x0;
        pSelect = (Select *)0x0;
        goto LAB_00162f2f;
      }
      local_c8 = CONCAT44(local_c8._4_4_,iVar9);
      local_138 = -1;
      local_130 = 0;
      uVar20 = 0;
    }
    else {
      iVar26 = pParse->nMem + 1;
      pParse->nMem = iVar26;
      iVar17 = p->nOp;
      sqlite3VdbeAddOp3(p,0xd,iVar26,0,iVar17 + 1);
      pDest = &dest;
      dest.eDest = '\r';
      local_c8 = CONCAT44(local_c8._4_4_,iVar9);
      if (!bVar30) {
        iVar9 = 0;
      }
      dest.zAffSdst = (char *)0x0;
      dest.nSdst = (int)pTab->nCol;
      dest.iSdst = iVar9;
      dest.iSDParm = iVar26;
      iVar9 = sqlite3Select(pParse,pSelect,pDest);
      uVar20 = dest._8_8_ & 0xffffffff;
      if ((iVar9 == 0) && (db->mallocFailed == '\0')) {
        if (pParse->nErr == 0) {
          local_118 = uVar20;
          sqlite3VdbeAddOp3(p,0x43,iVar26,0,0);
          pPVar13 = p->pParse;
          pPVar13->nTempReg = '\0';
          pPVar13->nRangeReg = 0;
          if (p->db->mallocFailed == '\0') {
            iVar9 = p->nOp + -1;
            if (-1 < iVar17) {
              iVar9 = iVar17;
            }
            pOVar22 = p->aOp + iVar9;
          }
          else {
            pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar22->p2 = p->nOp;
          uVar10 = pSelect->pEList->nExpr;
          if ((local_b0 == (Trigger *)0x0) && (iVar29 = readsTable(pParse,iVar29,pTab), iVar29 == 0)
             ) {
            bVar30 = true;
            local_130 = 0;
          }
          else {
            local_130 = 1;
            bVar30 = false;
          }
          bVar6 = true;
          if (bVar30) {
            local_138 = 0;
          }
          else {
            local_138 = pParse->nTab;
            pParse->nTab = local_138 + 1;
            if (pParse->nTempReg == '\0') {
              iVar29 = pParse->nMem + 1;
              pParse->nMem = iVar29;
            }
            else {
              bVar8 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar8;
              iVar29 = pParse->aTempReg[bVar8];
            }
            if (pParse->nTempReg == '\0') {
              iVar9 = pParse->nMem + 1;
              pParse->nMem = iVar9;
            }
            else {
              bVar8 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar8;
              iVar9 = pParse->aTempReg[bVar8];
            }
            local_108 = (ExprList_item *)CONCAT44(local_108._4_4_,iVar9);
            sqlite3VdbeAddOp3(p,0x71,local_138,uVar10,0);
            iVar9 = sqlite3VdbeAddOp3(p,0xe,dest.iSDParm,0,0);
            local_b8 = (IdList_item *)CONCAT44(local_b8._4_4_,iVar9);
            sqlite3VdbeAddOp3(p,0x5c,(int)local_118,uVar10,iVar29);
            iVar9 = (int)local_108;
            sqlite3VdbeAddOp3(p,0x79,local_138,(int)local_108,0);
            sqlite3VdbeAddOp3(p,0x7a,local_138,iVar29,iVar9);
            iVar9 = (int)local_b8;
            sqlite3VdbeAddOp3(p,0xb,0,(int)local_b8,0);
            if (p->db->mallocFailed == '\0') {
              iVar17 = p->nOp + -1;
              if (-1 < iVar9) {
                iVar17 = iVar9;
              }
              pOVar22 = p->aOp + iVar17;
            }
            else {
              pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar22->p2 = p->nOp;
            if (iVar29 != 0) {
              bVar8 = pParse->nTempReg;
              if ((ulong)bVar8 < 8) {
                pParse->nTempReg = bVar8 + 1;
                pParse->aTempReg[bVar8] = iVar29;
              }
            }
            if ((int)local_108 != 0) {
              bVar8 = pParse->nTempReg;
              if ((ulong)bVar8 < 8) {
                pParse->nTempReg = bVar8 + 1;
                pParse->aTempReg[bVar8] = (int)local_108;
              }
            }
          }
          pDest = (SelectDest *)(ulong)uVar10;
          pUpsert = local_100;
          uVar20 = local_118;
        }
        else {
          local_130 = 0;
          local_138 = 0;
          bVar6 = false;
        }
      }
      else {
        local_130 = 0;
        local_138 = 0;
        bVar6 = false;
      }
      uVar10 = (uint)pDest;
      if (!bVar6) {
        aRegIdx = (int *)0x0;
        goto LAB_00162f2f;
      }
    }
    if ((pColumn == (IdList *)0x0) && (0 < (int)uVar10)) {
      uVar27 = (ulong)(uint)(int)pTab->iPKey;
    }
    uVar16 = (uint)pTab->nCol;
    if ((int)uVar16 < 1) {
      iVar29 = 0;
    }
    else {
      lVar23 = 0;
      iVar29 = 0;
      do {
        iVar29 = iVar29 + (uint)(((&pTab->aCol->colFlags)[lVar23] >> 1 & 1) != 0);
        lVar23 = lVar23 + 0x20;
      } while ((ulong)uVar16 << 5 != lVar23);
    }
    if (((pColumn == (IdList *)0x0) && (uVar10 != 0)) && (uVar10 != uVar16 - iVar29)) {
      aRegIdx = (int *)0x0;
      sqlite3ErrorMsg(pParse,"table %S has %d columns but %d values were supplied",pTabList,0,
                      (ulong)(uVar16 - iVar29),(ulong)uVar10);
      goto LAB_00162f2f;
    }
    if ((pColumn != (IdList *)0x0) && (uVar10 != pColumn->nId)) {
      aRegIdx = (int *)0x0;
      sqlite3ErrorMsg(pParse,"%d values for %d columns",(ulong)uVar10);
      goto LAB_00162f2f;
    }
    local_d8 = 0;
    if ((((db->flags & 0x80) != 0) && (pParse->nested == '\0')) &&
       (pParse->pTriggerTab == (Table *)0x0)) {
      uVar16 = pParse->nMem + 1;
      local_d8 = (ulong)uVar16;
      pParse->nMem = uVar16;
      sqlite3VdbeAddOp3(p,0x46,0,uVar16,0);
    }
    if (local_e0 == (Select *)0x0) {
      uVar16 = sqlite3OpenTableAndIndices(pParse,pTab,0x6d,'\0',-1,(u8 *)0x0,&iDataCur,&iIdxCur);
      aRegIdx = (int *)sqlite3DbMallocRawNN(db,(long)(int)uVar16 * 4 + 4);
      if (aRegIdx == (int *)0x0) goto LAB_00162f2f;
      if (0 < (int)uVar16) {
        ppIVar11 = &pTab->pIndex;
        uVar21 = 0;
        do {
          pIVar5 = *ppIVar11;
          iVar29 = pParse->nMem + 1;
          pParse->nMem = iVar29;
          aRegIdx[uVar21] = iVar29;
          pParse->nMem = pParse->nMem + (uint)pIVar5->nColumn;
          ppIVar11 = &pIVar5->pNext;
          uVar21 = uVar21 + 1;
        } while (uVar16 != uVar21);
      }
      if (aRegIdx == (int *)0x0) goto LAB_00162f2f;
    }
    else {
      aRegIdx = (int *)0x0;
    }
    if (pUpsert != (Upsert *)0x0) {
      if (pTab->nModuleArg != 0) {
        sqlite3ErrorMsg(pParse,"UPSERT not implemented for virtual table \"%s\"",pTab->zName);
        goto LAB_00162f2f;
      }
      pTabList->a[0].iCursor = iDataCur;
      pUpsert->pUpsertSrc = pTabList;
      pUpsert->regData = (int)local_c8;
      pUpsert->iDataCur = iDataCur;
      pUpsert->iIdxCur = iIdxCur;
      if (pUpsert->pUpsertTarget != (ExprList *)0x0) {
        sqlite3UpsertAnalyzeTarget(pParse,pTabList,pUpsert);
      }
    }
    if (local_130 == 0) {
      if (pSelect == (Select *)0x0) {
        local_f0 = 0;
        local_f4 = 0;
      }
      else {
        local_f4 = sqlite3VdbeAddOp3(p,0xe,dest.iSDParm,0,0);
        local_f0 = local_f4;
      }
    }
    else {
      local_f4 = sqlite3VdbeAddOp3(p,0x24,local_138,0,0);
      local_f0 = p->nOp;
    }
    uVar16 = pParse->nLabel - 1;
    local_98 = (ulong)uVar16;
    pParse->nLabel = uVar16;
    iVar29 = (int)uVar27;
    if ((tmask & 1U) != 0) {
      local_118 = uVar20;
      uVar16 = sqlite3GetTempRange(pParse,pTab->nCol + 1);
      local_d0 = (ulong)uVar16;
      if (iVar29 < 0) {
        iVar17 = 0x46;
        iVar9 = -1;
      }
      else {
        if (local_130 == 0) {
          sqlite3ExprCode(pParse,local_158->a[uVar27].pExpr,uVar16);
        }
        else {
          sqlite3VdbeAddOp3(p,0x5a,local_138,iVar29,uVar16);
        }
        iVar9 = sqlite3VdbeAddOp3(p,0x33,uVar16,0,0);
        sqlite3VdbeAddOp3(p,0x46,-1,uVar16,0);
        if (p->db->mallocFailed == '\0') {
          iVar17 = p->nOp + -1;
          if (-1 < iVar9) {
            iVar17 = iVar9;
          }
          pOVar22 = p->aOp + iVar17;
        }
        else {
          pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar22->p2 = p->nOp;
        iVar17 = 0xf;
        iVar9 = (int)local_d0;
        uVar16 = 0;
      }
      sqlite3VdbeAddOp3(p,iVar17,iVar9,uVar16,0);
      if (0 < pTab->nCol) {
        local_b8 = (IdList_item *)CONCAT71(local_b8._1_7_,local_158 != (ExprList *)0x0 | local_130);
        local_108 = (ExprList_item *)(ulong)((int)local_d0 + 1);
        local_90 = local_158->a;
        uVar20 = 0;
        uVar21 = 0;
        do {
          if (pColumn != (IdList *)0x0) {
            uVar16 = pColumn->nId;
            if ((int)uVar16 < 1) {
              uVar21 = 0;
            }
            else {
              piVar12 = &pColumn->a->idx;
              uVar21 = 0;
              do {
                if (uVar20 == (uint)*piVar12) goto LAB_00163b8f;
                uVar21 = uVar21 + 1;
                piVar12 = piVar12 + 4;
              } while (uVar16 != uVar21);
              uVar21 = (ulong)uVar16;
            }
          }
LAB_00163b8f:
          iVar26 = (int)uVar21;
          iVar17 = (int)uVar20;
          iVar9 = (int)local_108;
          if (((char)local_b8 == '\0') || ((pColumn != (IdList *)0x0 && (pColumn->nId <= iVar26))))
          {
            sqlite3ExprCode(pParse,pTab->aCol[uVar20].pDflt,iVar9 + iVar17);
          }
          else if (local_130 == 0) {
            sqlite3ExprCodeAndCache(pParse,local_90[iVar26].pExpr,iVar9 + iVar17);
          }
          else {
            sqlite3VdbeAddOp3(p,0x5a,local_138,iVar26,iVar9 + iVar17);
          }
          uVar21 = (ulong)(iVar26 + (uint)(pColumn == (IdList *)0x0));
          uVar20 = uVar20 + 1;
        } while ((long)uVar20 < (long)pTab->nCol);
      }
      if (local_e0 == (Select *)0x0) {
        sqlite3TableAffinity(p,pTab,(int)local_d0 + 1);
      }
      sqlite3CodeRowTrigger
                (pParse,local_b0,0x78,(ExprList *)0x0,1,pTab,~(int)pTab->nCol + (int)local_d0,
                 (int)local_a8,(int)local_98);
      sVar1 = pTab->nCol;
      uVar20 = local_118;
      if (sVar1 == 0) {
        if ((int)local_d0 != 0) {
          bVar8 = pParse->nTempReg;
          if ((ulong)bVar8 < 8) {
            pParse->nTempReg = bVar8 + 1;
            piVar12 = pParse->aTempReg + bVar8;
            goto LAB_00163d1a;
          }
        }
      }
      else if (pParse->nRangeReg <= (int)sVar1) {
        pParse->nRangeReg = sVar1 + 1;
        piVar12 = &pParse->iRangeReg;
LAB_00163d1a:
        *piVar12 = (int)local_d0;
      }
    }
    if (local_e0 == (Select *)0x0) {
      local_118 = uVar20;
      if (pTab->nModuleArg != 0) {
        sqlite3VdbeAddOp3(p,0x49,0,local_e8,0);
      }
      iVar9 = (int)local_110;
      if (iVar29 < 0) {
        if ((pTab->nModuleArg != 0) ||
           (uVar20 = local_c0 & 1, local_c0 = local_c0 & 0xffffffffffffff01, uVar20 != 0)) {
          iVar17 = 0x49;
          iVar29 = 0;
          goto LAB_001641ce;
        }
LAB_00163dbd:
        sqlite3VdbeAddOp3(p,0x79,iDataCur,iVar9,local_ec);
        local_128 = 1;
      }
      else {
        if (local_130 == 0) {
          if (pSelect != (Select *)0x0) {
            iVar17 = iVar29 + (int)local_118;
            op = 0x4e;
            iVar26 = 0;
            iVar29 = iVar9;
            goto LAB_00163ed8;
          }
          pExpr = local_158->a[uVar27].pExpr;
          if ((pExpr->op == 'r') && (pTab->nModuleArg == 0)) goto LAB_00163dbd;
          sqlite3ExprCode(pParse,pExpr,iVar9);
        }
        else {
          op = 0x5a;
          iVar17 = local_138;
          iVar26 = iVar9;
LAB_00163ed8:
          sqlite3VdbeAddOp3(p,op,iVar17,iVar29,iVar26);
        }
        iVar29 = (int)local_110;
        if (pTab->nModuleArg == 0) {
          iVar9 = sqlite3VdbeAddOp3(p,0x33,iVar29,0,0);
          sqlite3VdbeAddOp3(p,0x79,iDataCur,iVar29,local_ec);
          if (p->db->mallocFailed == '\0') {
            iVar29 = p->nOp + -1;
            if (-1 < iVar9) {
              iVar29 = iVar9;
            }
            pOVar22 = p->aOp + iVar29;
          }
          else {
            pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar22->p2 = p->nOp;
        }
        else {
          sqlite3VdbeAddOp3(p,0x32,iVar29,p->nOp + 2,0);
        }
        iVar17 = 0xf;
        iVar29 = (int)local_110;
        iVar9 = 0;
LAB_001641ce:
        local_128 = 0;
        sqlite3VdbeAddOp3(p,iVar17,iVar29,iVar9,0);
      }
      if (0 < local_ec) {
        sqlite3VdbeAddOp3(pParse->pVdbe,0x97,local_ec,(int)local_110,0);
      }
      if (0 < pTab->nCol) {
        local_108 = local_158->a;
        local_c0 = local_c8 & 0xffffffff;
        uVar20 = 0;
        local_e0 = (Select *)((ulong)local_e0 & 0xffffffff00000000);
        do {
          iVar29 = (int)local_c0 + (int)uVar20;
          if (uVar20 == (uint)(int)pTab->iPKey) {
            iVar26 = 0x4a;
            iVar17 = iVar29;
            iVar9 = 0;
LAB_00164266:
            iVar29 = 0;
LAB_00164269:
            sqlite3VdbeAddOp3(p,iVar26,iVar17,iVar9,iVar29);
          }
          else {
            if (pColumn == (IdList *)0x0) {
              if ((pTab->aCol[uVar20].colFlags & 2) == 0) {
                uVar21 = (ulong)(uint)((int)uVar20 - (int)local_e0);
              }
              else {
                local_e0 = (Select *)CONCAT44(local_e0._4_4_,(int)local_e0 + 1);
                uVar21 = 0xffffffff;
              }
            }
            else {
              uVar16 = pColumn->nId;
              if ((int)uVar16 < 1) {
                uVar21 = 0;
              }
              else {
                piVar12 = &pColumn->a->idx;
                uVar21 = 0;
                do {
                  if (uVar20 == (uint)*piVar12) goto LAB_001642d5;
                  uVar21 = uVar21 + 1;
                  piVar12 = piVar12 + 4;
                } while (uVar16 != uVar21);
                uVar21 = (ulong)uVar16;
              }
            }
LAB_001642d5:
            iVar9 = (int)uVar21;
            if (((iVar9 < 0) || (uVar10 == 0)) ||
               ((pColumn != (IdList *)0x0 && (pColumn->nId <= iVar9)))) {
              sqlite3ExprCodeFactorable(pParse,pTab->aCol[uVar20].pDflt,iVar29);
            }
            else {
              if (local_130 != 0) {
                iVar26 = 0x5a;
                iVar17 = local_138;
                goto LAB_00164269;
              }
              if (pSelect == (Select *)0x0) {
                sqlite3ExprCode(pParse,local_108[uVar21 & 0xffffffff].pExpr,iVar29);
              }
              else if ((int)local_118 != (int)local_c8) {
                iVar17 = iVar9 + (int)local_118;
                iVar26 = 0x4f;
                iVar9 = iVar29;
                goto LAB_00164266;
              }
            }
          }
          uVar20 = uVar20 + 1;
        } while ((long)uVar20 < (long)pTab->nCol);
      }
      uVar10 = local_e8;
      if (pTab->nModuleArg == 0) {
        sqlite3GenerateConstraintChecks
                  (pParse,pTab,aRegIdx,iDataCur,iIdxCur,local_e8,0,
                   (byte)~(byte)(uVar27 >> 0x18) >> 7,(u8)local_a8,(int)local_98,(int *)&sNC,
                   (int *)0x0,local_100);
        uVar16 = 0;
        sqlite3FkCheck(pParse,pTab,0,uVar10,(int *)0x0,0);
        if ((int)sNC.pParse == 0) {
          uVar16 = 1;
        }
        else if ((local_b0 == (Trigger *)0x0) && (uVar16 = 1, (db->flags & 0x4000) != 0)) {
          pHVar14 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
          uVar16 = (uint)(pHVar14->data == (void *)0x0);
        }
        sqlite3CompleteInsertion(pParse,pTab,iDataCur,iIdxCur,local_e8,aRegIdx,0,local_128,uVar16);
      }
      else {
        for (zP4 = pTab->pVTable; (zP4 != (VTable *)0x0 && (zP4->db != db)); zP4 = zP4->pNext) {
        }
        sqlite3VtabMakeWritable(pParse,pTab);
        iVar29 = sqlite3VdbeAddOp3(p,10,1,pTab->nCol + 2,local_e8);
        sqlite3VdbeChangeP4(p,iVar29,(char *)zP4,-0xc);
        if (0 < (long)p->nOp) {
          uVar15 = 2;
          if ((int)local_a8 != 0xb) {
            uVar15 = (u16)local_a8;
          }
          p->aOp[(long)p->nOp + -1].p5 = uVar15;
        }
        pPVar13 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar13 = pParse;
        }
        pPVar13->mayAbort = '\x01';
      }
    }
    pTrigger = local_b0;
    iVar29 = (int)local_d8;
    if (iVar29 != 0) {
      sqlite3VdbeAddOp3(p,0x53,iVar29,1,0);
    }
    if (pTrigger != (Trigger *)0x0) {
      sqlite3CodeRowTrigger
                (pParse,pTrigger,0x78,(ExprList *)0x0,2,pTab,(int)local_110 + ~(int)pTab->nCol,
                 (int)local_a8,(int)local_98);
    }
    sqlite3VdbeResolveLabel(p,(int)local_98);
    pUpsert = local_100;
    if (local_130 == 0) {
      if (pSelect != (Select *)0x0) {
        sqlite3VdbeAddOp3(p,0xb,0,local_f0,0);
        if (p->db->mallocFailed == '\0') {
          iVar29 = p->nOp + -1;
          if (-1 < local_f4) {
            iVar29 = local_f4;
          }
          pOVar22 = p->aOp + iVar29;
        }
        else {
          pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar22->p2 = p->nOp;
      }
      iVar29 = (int)local_d8;
      pUpsert = local_100;
    }
    else {
      sqlite3VdbeAddOp3(p,5,local_138,local_f0,0);
      if (p->db->mallocFailed == '\0') {
        iVar9 = p->nOp + -1;
        if (-1 < local_f4) {
          iVar9 = local_f4;
        }
        pOVar22 = p->aOp + iVar9;
      }
      else {
        pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar22->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x75,local_138,0,0);
    }
  }
  if (((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) &&
     (pParse->pAinc != (AutoincInfo *)0x0)) {
    autoIncrementEnd(pParse);
  }
  if (iVar29 != 0) {
    sqlite3VdbeAddOp3(p,0x51,iVar29,1,0);
    sqlite3VdbeSetNumCols(p,1);
    if (p->db->mallocFailed == '\0') {
      sqlite3VdbeMemSetStr(p->aColName,"rows inserted",-1,'\x01',(_func_void_void_ptr *)0x0);
    }
  }
LAB_00162f2f:
  sqlite3SrcListDelete(db,pTabList);
  if (local_158 != (ExprList *)0x0) {
    exprListDeleteNN(db,local_158);
  }
  sqlite3UpsertDelete(db,pUpsert);
  if (pSelect != (Select *)0x0) {
    clearSelect(db,pSelect,1);
  }
  sqlite3IdListDelete(db,pColumn);
  if (aRegIdx != (int *)0x0) {
    sqlite3DbFreeNN(db,aRegIdx);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Insert(
  Parse *pParse,        /* Parser context */
  SrcList *pTabList,    /* Name of table into which we are inserting */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  IdList *pColumn,      /* Column names corresponding to IDLIST. */
  int onError,          /* How to handle constraint errors */
  Upsert *pUpsert       /* ON CONFLICT clauses for upsert, or NULL */
){
  sqlite3 *db;          /* The main database structure */
  Table *pTab;          /* The table to insert into.  aka TABLE */
  int i, j;             /* Loop counters */
  Vdbe *v;              /* Generate code into this virtual machine */
  Index *pIdx;          /* For looping over indices of the table */
  int nColumn;          /* Number of columns in the data */
  int nHidden = 0;      /* Number of hidden columns if TABLE is virtual */
  int iDataCur = 0;     /* VDBE cursor that is the main data repository */
  int iIdxCur = 0;      /* First index cursor */
  int ipkColumn = -1;   /* Column that is the INTEGER PRIMARY KEY */
  int endOfLoop;        /* Label for the end of the insertion loop */
  int srcTab = 0;       /* Data comes from this temporary cursor if >=0 */
  int addrInsTop = 0;   /* Jump to label "D" */
  int addrCont = 0;     /* Top of insert loop. Label "C" in templates 3 and 4 */
  SelectDest dest;      /* Destination for SELECT on rhs of INSERT */
  int iDb;              /* Index of database holding TABLE */
  u8 useTempTable = 0;  /* Store SELECT results in intermediate table */
  u8 appendFlag = 0;    /* True if the insert is likely to be an append */
  u8 withoutRowid;      /* 0 for normal table.  1 for WITHOUT ROWID table */
  u8 bIdListInOrder;    /* True if IDLIST is in table order */
  ExprList *pList = 0;  /* List of VALUES() to be inserted  */

  /* Register allocations */
  int regFromSelect = 0;/* Base register for data coming from SELECT */
  int regAutoinc = 0;   /* Register holding the AUTOINCREMENT counter */
  int regRowCount = 0;  /* Memory cell used for the row counter */
  int regIns;           /* Block of regs holding rowid+data being inserted */
  int regRowid;         /* registers holding insert rowid */
  int regData;          /* register holding first column to insert */
  int *aRegIdx = 0;     /* One register allocated to each index */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                 /* True if attempting to insert into a view */
  Trigger *pTrigger;          /* List of triggers on pTab, if required */
  int tmask;                  /* Mask of trigger times */
#endif

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto insert_cleanup;
  }
  dest.iSDParm = 0;  /* Suppress a harmless compiler warning */

  /* If the Select object is really just a simple VALUES() list with a
  ** single row (the common case) then keep that one row of values
  ** and discard the other (unused) parts of the pSelect object
  */
  if( pSelect && (pSelect->selFlags & SF_Values)!=0 && pSelect->pPrior==0 ){
    pList = pSelect->pEList;
    pSelect->pEList = 0;
    sqlite3SelectDelete(db, pSelect);
    pSelect = 0;
  }

  /* Locate the table into which we will be inserting new information.
  */
  assert( pTabList->nSrc==1 );
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ){
    goto insert_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  if( sqlite3AuthCheck(pParse, SQLITE_INSERT, pTab->zName, 0,
                       db->aDb[iDb].zDbSName) ){
    goto insert_cleanup;
  }
  withoutRowid = !HasRowid(pTab);

  /* Figure out if we have any triggers and if the table being
  ** inserted into is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_INSERT, 0, &tmask);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define tmask 0
# define isView 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif
  assert( (pTrigger && tmask) || (pTrigger==0 && tmask==0) );

  /* If pTab is really a view, make sure it has been initialized.
  ** ViewGetColumnNames() is a no-op if pTab is not a view.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto insert_cleanup;
  }

  /* Cannot insert into a read-only table.
  */
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto insert_cleanup;
  }

  /* Allocate a VDBE
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto insert_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, pSelect || pTrigger, iDb);

#ifndef SQLITE_OMIT_XFER_OPT
  /* If the statement is of the form
  **
  **       INSERT INTO <table1> SELECT * FROM <table2>;
  **
  ** Then special optimizations can be applied that make the transfer
  ** very fast and which reduce fragmentation of indices.
  **
  ** This is the 2nd template.
  */
  if( pColumn==0 && xferOptimization(pParse, pTab, pSelect, onError, iDb) ){
    assert( !pTrigger );
    assert( pList==0 );
    goto insert_end;
  }
#endif /* SQLITE_OMIT_XFER_OPT */

  /* If this is an AUTOINCREMENT table, look up the sequence number in the
  ** sqlite_sequence table and store it in memory cell regAutoinc.
  */
  regAutoinc = autoIncBegin(pParse, iDb, pTab);

  /* Allocate registers for holding the rowid of the new row,
  ** the content of the new row, and the assembled row record.
  */
  regRowid = regIns = pParse->nMem+1;
  pParse->nMem += pTab->nCol + 1;
  if( IsVirtual(pTab) ){
    regRowid++;
    pParse->nMem++;
  }
  regData = regRowid+1;

  /* If the INSERT statement included an IDLIST term, then make sure
  ** all elements of the IDLIST really are columns of the table and 
  ** remember the column indices.
  **
  ** If the table has an INTEGER PRIMARY KEY column and that column
  ** is named in the IDLIST, then record in the ipkColumn variable
  ** the index into IDLIST of the primary key column.  ipkColumn is
  ** the index of the primary key as it appears in IDLIST, not as
  ** is appears in the original table.  (The index of the INTEGER
  ** PRIMARY KEY in the original table is pTab->iPKey.)
  */
  bIdListInOrder = (pTab->tabFlags & TF_OOOHidden)==0;
  if( pColumn ){
    for(i=0; i<pColumn->nId; i++){
      pColumn->a[i].idx = -1;
    }
    for(i=0; i<pColumn->nId; i++){
      for(j=0; j<pTab->nCol; j++){
        if( sqlite3StrICmp(pColumn->a[i].zName, pTab->aCol[j].zName)==0 ){
          pColumn->a[i].idx = j;
          if( i!=j ) bIdListInOrder = 0;
          if( j==pTab->iPKey ){
            ipkColumn = i;  assert( !withoutRowid );
          }
          break;
        }
      }
      if( j>=pTab->nCol ){
        if( sqlite3IsRowid(pColumn->a[i].zName) && !withoutRowid ){
          ipkColumn = i;
          bIdListInOrder = 0;
        }else{
          sqlite3ErrorMsg(pParse, "table %S has no column named %s",
              pTabList, 0, pColumn->a[i].zName);
          pParse->checkSchema = 1;
          goto insert_cleanup;
        }
      }
    }
  }

  /* Figure out how many columns of data are supplied.  If the data
  ** is coming from a SELECT statement, then generate a co-routine that
  ** produces a single row of the SELECT on each invocation.  The
  ** co-routine is the common header to the 3rd and 4th templates.
  */
  if( pSelect ){
    /* Data is coming from a SELECT or from a multi-row VALUES clause.
    ** Generate a co-routine to run the SELECT. */
    int regYield;       /* Register holding co-routine entry-point */
    int addrTop;        /* Top of the co-routine */
    int rc;             /* Result code */

    regYield = ++pParse->nMem;
    addrTop = sqlite3VdbeCurrentAddr(v) + 1;
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
    sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
    dest.iSdst = bIdListInOrder ? regData : 0;
    dest.nSdst = pTab->nCol;
    rc = sqlite3Select(pParse, pSelect, &dest);
    regFromSelect = dest.iSdst;
    if( rc || db->mallocFailed || pParse->nErr ) goto insert_cleanup;
    sqlite3VdbeEndCoroutine(v, regYield);
    sqlite3VdbeJumpHere(v, addrTop - 1);                       /* label B: */
    assert( pSelect->pEList );
    nColumn = pSelect->pEList->nExpr;

    /* Set useTempTable to TRUE if the result of the SELECT statement
    ** should be written into a temporary table (template 4).  Set to
    ** FALSE if each output row of the SELECT can be written directly into
    ** the destination table (template 3).
    **
    ** A temp table must be used if the table being updated is also one
    ** of the tables being read by the SELECT statement.  Also use a 
    ** temp table in the case of row triggers.
    */
    if( pTrigger || readsTable(pParse, iDb, pTab) ){
      useTempTable = 1;
    }

    if( useTempTable ){
      /* Invoke the coroutine to extract information from the SELECT
      ** and add it to a transient table srcTab.  The code generated
      ** here is from the 4th template:
      **
      **      B: open temp table
      **      L: yield X, goto M at EOF
      **         insert row from R..R+n into temp table
      **         goto L
      **      M: ...
      */
      int regRec;          /* Register to hold packed record */
      int regTempRowid;    /* Register to hold temp table ROWID */
      int addrL;           /* Label "L" */

      srcTab = pParse->nTab++;
      regRec = sqlite3GetTempReg(pParse);
      regTempRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, srcTab, nColumn);
      addrL = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm); VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regFromSelect, nColumn, regRec);
      sqlite3VdbeAddOp2(v, OP_NewRowid, srcTab, regTempRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, srcTab, regRec, regTempRowid);
      sqlite3VdbeGoto(v, addrL);
      sqlite3VdbeJumpHere(v, addrL);
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempReg(pParse, regTempRowid);
    }
  }else{
    /* This is the case if the data for the INSERT is coming from a 
    ** single-row VALUES clause
    */
    NameContext sNC;
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    srcTab = -1;
    assert( useTempTable==0 );
    if( pList ){
      nColumn = pList->nExpr;
      if( sqlite3ResolveExprListNames(&sNC, pList) ){
        goto insert_cleanup;
      }
    }else{
      nColumn = 0;
    }
  }

  /* If there is no IDLIST term but the table has an integer primary
  ** key, the set the ipkColumn variable to the integer primary key 
  ** column index in the original table definition.
  */
  if( pColumn==0 && nColumn>0 ){
    ipkColumn = pTab->iPKey;
  }

  /* Make sure the number of columns in the source data matches the number
  ** of columns to be inserted into the table.
  */
  for(i=0; i<pTab->nCol; i++){
    nHidden += (IsHiddenColumn(&pTab->aCol[i]) ? 1 : 0);
  }
  if( pColumn==0 && nColumn && nColumn!=(pTab->nCol-nHidden) ){
    sqlite3ErrorMsg(pParse, 
       "table %S has %d columns but %d values were supplied",
       pTabList, 0, pTab->nCol-nHidden, nColumn);
    goto insert_cleanup;
  }
  if( pColumn!=0 && nColumn!=pColumn->nId ){
    sqlite3ErrorMsg(pParse, "%d values for %d columns", nColumn, pColumn->nId);
    goto insert_cleanup;
  }
    
  /* Initialize the count of rows to be inserted
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
  ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  /* If this is not a view, open the table and and all indices */
  if( !isView ){
    int nIdx;
    nIdx = sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, 0, -1, 0,
                                      &iDataCur, &iIdxCur);
    aRegIdx = sqlite3DbMallocRawNN(db, sizeof(int)*(nIdx+1));
    if( aRegIdx==0 ){
      goto insert_cleanup;
    }
    for(i=0, pIdx=pTab->pIndex; i<nIdx; pIdx=pIdx->pNext, i++){
      assert( pIdx );
      aRegIdx[i] = ++pParse->nMem;
      pParse->nMem += pIdx->nColumn;
    }
  }
#ifndef SQLITE_OMIT_UPSERT
  if( pUpsert ){
    if( IsVirtual(pTab) ){
      sqlite3ErrorMsg(pParse, "UPSERT not implemented for virtual table \"%s\"",
              pTab->zName);
      goto insert_cleanup;
    }
    pTabList->a[0].iCursor = iDataCur;
    pUpsert->pUpsertSrc = pTabList;
    pUpsert->regData = regData;
    pUpsert->iDataCur = iDataCur;
    pUpsert->iIdxCur = iIdxCur;
    if( pUpsert->pUpsertTarget ){
      sqlite3UpsertAnalyzeTarget(pParse, pTabList, pUpsert);
    }
  }
#endif


  /* This is the top of the main insertion loop */
  if( useTempTable ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 4):
    **
    **         rewind temp table, if empty goto D
    **      C: loop over rows of intermediate table
    **           transfer values form intermediate table into <table>
    **         end loop
    **      D: ...
    */
    addrInsTop = sqlite3VdbeAddOp1(v, OP_Rewind, srcTab); VdbeCoverage(v);
    addrCont = sqlite3VdbeCurrentAddr(v);
  }else if( pSelect ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 3):
    **
    **      C: yield X, at EOF goto D
    **         insert the select result into <table> from R..R+n
    **         goto C
    **      D: ...
    */
    addrInsTop = addrCont = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
    VdbeCoverage(v);
  }

  /* Run the BEFORE and INSTEAD OF triggers, if there are any
  */
  endOfLoop = sqlite3VdbeMakeLabel(pParse);
  if( tmask & TRIGGER_BEFORE ){
    int regCols = sqlite3GetTempRange(pParse, pTab->nCol+1);

    /* build the NEW.* reference row.  Note that if there is an INTEGER
    ** PRIMARY KEY into which a NULL is being inserted, that NULL will be
    ** translated into a unique ID for the row.  But on a BEFORE trigger,
    ** we do not know what the unique ID will be (because the insert has
    ** not happened yet) so we substitute a rowid of -1
    */
    if( ipkColumn<0 ){
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
    }else{
      int addr1;
      assert( !withoutRowid );
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regCols);
      }else{
        assert( pSelect==0 );  /* Otherwise useTempTable is true */
        sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regCols);
      }
      addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regCols); VdbeCoverage(v);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
      sqlite3VdbeJumpHere(v, addr1);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, regCols); VdbeCoverage(v);
    }

    /* Cannot have triggers on a virtual table. If it were possible,
    ** this block would have to account for hidden column.
    */
    assert( !IsVirtual(pTab) );

    /* Create the new column data
    */
    for(i=j=0; i<pTab->nCol; i++){
      if( pColumn ){
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( (!useTempTable && !pList) || (pColumn && j>=pColumn->nId)
            || (pColumn==0 && IsOrdinaryHiddenColumn(&pTab->aCol[i])) ){
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regCols+i+1);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, regCols+i+1); 
      }else{
        assert( pSelect==0 ); /* Otherwise useTempTable is true */
        sqlite3ExprCodeAndCache(pParse, pList->a[j].pExpr, regCols+i+1);
      }
      if( pColumn==0 && !IsOrdinaryHiddenColumn(&pTab->aCol[i]) ) j++;
    }

    /* If this is an INSERT on a view with an INSTEAD OF INSERT trigger,
    ** do not attempt any conversions before assembling the record.
    ** If this is a real table, attempt conversions as required by the
    ** table column affinities.
    */
    if( !isView ){
      sqlite3TableAffinity(v, pTab, regCols+1);
    }

    /* Fire BEFORE or INSTEAD OF triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_BEFORE, 
        pTab, regCols-pTab->nCol-1, onError, endOfLoop);

    sqlite3ReleaseTempRange(pParse, regCols, pTab->nCol+1);
  }

  /* Compute the content of the next row to insert into a range of
  ** registers beginning at regIns.
  */
  if( !isView ){
    if( IsVirtual(pTab) ){
      /* The row that the VUpdate opcode will delete: none */
      sqlite3VdbeAddOp2(v, OP_Null, 0, regIns);
    }
    if( ipkColumn>=0 ){
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regRowid);
      }else if( pSelect ){
        sqlite3VdbeAddOp2(v, OP_Copy, regFromSelect+ipkColumn, regRowid);
      }else{
        Expr *pIpk = pList->a[ipkColumn].pExpr;
        if( pIpk->op==TK_NULL && !IsVirtual(pTab) ){
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          appendFlag = 1;
        }else{
          sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regRowid);
        }
      }
      /* If the PRIMARY KEY expression is NULL, then use OP_NewRowid
      ** to generate a unique primary key value.
      */
      if( !appendFlag ){
        int addr1;
        if( !IsVirtual(pTab) ){
          addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regRowid); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          sqlite3VdbeJumpHere(v, addr1);
        }else{
          addr1 = sqlite3VdbeCurrentAddr(v);
          sqlite3VdbeAddOp2(v, OP_IsNull, regRowid, addr1+2); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp1(v, OP_MustBeInt, regRowid); VdbeCoverage(v);
      }
    }else if( IsVirtual(pTab) || withoutRowid ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, regRowid);
    }else{
      sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
      appendFlag = 1;
    }
    autoIncStep(pParse, regAutoinc, regRowid);

    /* Compute data for all columns of the new entry, beginning
    ** with the first column.
    */
    nHidden = 0;
    for(i=0; i<pTab->nCol; i++){
      int iRegStore = regRowid+1+i;
      if( i==pTab->iPKey ){
        /* The value of the INTEGER PRIMARY KEY column is always a NULL.
        ** Whenever this column is read, the rowid will be substituted
        ** in its place.  Hence, fill this column with a NULL to avoid
        ** taking up data space with information that will never be used.
        ** As there may be shallow copies of this value, make it a soft-NULL */
        sqlite3VdbeAddOp1(v, OP_SoftNull, iRegStore);
        continue;
      }
      if( pColumn==0 ){
        if( IsHiddenColumn(&pTab->aCol[i]) ){
          j = -1;
          nHidden++;
        }else{
          j = i - nHidden;
        }
      }else{
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( j<0 || nColumn==0 || (pColumn && j>=pColumn->nId) ){
        sqlite3ExprCodeFactorable(pParse, pTab->aCol[i].pDflt, iRegStore);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, iRegStore); 
      }else if( pSelect ){
        if( regFromSelect!=regData ){
          sqlite3VdbeAddOp2(v, OP_SCopy, regFromSelect+j, iRegStore);
        }
      }else{
        sqlite3ExprCode(pParse, pList->a[j].pExpr, iRegStore);
      }
    }

    /* Generate code to check constraints and generate index keys and
    ** do the insertion.
    */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      sqlite3VdbeAddOp4(v, OP_VUpdate, 1, pTab->nCol+2, regIns, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
      sqlite3MayAbort(pParse);
    }else
#endif
    {
      int isReplace;    /* Set to true if constraints may cause a replace */
      int bUseSeek;     /* True to use OPFLAG_SEEKRESULT */
      sqlite3GenerateConstraintChecks(pParse, pTab, aRegIdx, iDataCur, iIdxCur,
          regIns, 0, ipkColumn>=0, onError, endOfLoop, &isReplace, 0, pUpsert
      );
      sqlite3FkCheck(pParse, pTab, 0, regIns, 0, 0);

      /* Set the OPFLAG_USESEEKRESULT flag if either (a) there are no REPLACE
      ** constraints or (b) there are no triggers and this table is not a
      ** parent table in a foreign key constraint. It is safe to set the
      ** flag in the second case as if any REPLACE constraint is hit, an
      ** OP_Delete or OP_IdxDelete instruction will be executed on each 
      ** cursor that is disturbed. And these instructions both clear the
      ** VdbeCursor.seekResult variable, disabling the OPFLAG_USESEEKRESULT
      ** functionality.  */
      bUseSeek = (isReplace==0 || (pTrigger==0 &&
          ((db->flags & SQLITE_ForeignKeys)==0 || sqlite3FkReferences(pTab)==0)
      ));
      sqlite3CompleteInsertion(pParse, pTab, iDataCur, iIdxCur,
          regIns, aRegIdx, 0, appendFlag, bUseSeek
      );
    }
  }

  /* Update the count of rows that are inserted
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  if( pTrigger ){
    /* Code AFTER triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_AFTER, 
        pTab, regData-2-pTab->nCol, onError, endOfLoop);
  }

  /* The bottom of the main insertion loop, if the data source
  ** is a SELECT statement.
  */
  sqlite3VdbeResolveLabel(v, endOfLoop);
  if( useTempTable ){
    sqlite3VdbeAddOp2(v, OP_Next, srcTab, addrCont); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrInsTop);
    sqlite3VdbeAddOp1(v, OP_Close, srcTab);
  }else if( pSelect ){
    sqlite3VdbeGoto(v, addrCont);
    sqlite3VdbeJumpHere(v, addrInsTop);
  }

insert_end:
  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows inserted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows inserted", SQLITE_STATIC);
  }

insert_cleanup:
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pList);
  sqlite3UpsertDelete(db, pUpsert);
  sqlite3SelectDelete(db, pSelect);
  sqlite3IdListDelete(db, pColumn);
  sqlite3DbFree(db, aRegIdx);
}